

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VAddConst(N_Vector X,N_Vector Z,sunindextype local_length,int myid)

{
  int iVar1;
  uint in_ECX;
  undefined8 in_RSI;
  N_Vector in_RDI;
  double dVar2;
  double dVar3;
  double maxt;
  double stop_time;
  double start_time;
  int failure;
  int fails;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar4;
  int iVar5;
  
  iVar5 = 0;
  uVar4 = 0;
  N_VConst(0x3ff0000000000000,in_RDI);
  N_VConst(0,in_RSI);
  dVar2 = get_time();
  N_VAddConst(0xc000000000000000,in_RDI,in_RSI);
  sync_device(in_RDI);
  dVar3 = get_time();
  iVar1 = check_ans((sunrealtype)CONCAT44(in_ECX,iVar5),
                    (N_Vector)CONCAT44(uVar4,in_stack_ffffffffffffffd8),(sunindextype)dVar2);
  if (iVar1 == 0) {
    if (in_ECX == 0) {
      printf("PASSED test -- N_VAddConst \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VAddConst, Proc %d \n",(ulong)in_ECX);
    iVar5 = iVar5 + 1;
  }
  dVar2 = max_time(in_RDI,dVar3 - dVar2);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar2,"N_VAddConst");
  }
  return iVar5;
}

Assistant:

int Test_N_VAddConst(N_Vector X, N_Vector Z, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;

  /* fill vector data */
  N_VConst(ONE, X);
  N_VConst(ZERO, Z);

  start_time = get_time();
  N_VAddConst(X, NEG_TWO, Z);
  sync_device(X);
  stop_time = get_time();

  /* Z should be vector of -1 */
  failure = check_ans(NEG_ONE, Z, local_length);

  if (failure)
  {
    printf(">>> FAILED test -- N_VAddConst, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VAddConst \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VAddConst", maxt);

  return (fails);
}